

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

bool __thiscall
google::protobuf::internal::KeyMapBase<bool>::revalidate_if_necessary
          (KeyMapBase<bool> *this,map_index_t *bucket_index,KeyNode *node,TreeIterator *it)

{
  KeyNode *node_00;
  NodeBase *pNVar1;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  uint uVar2;
  map_index_t b;
  TableEntryPtr *pTVar3;
  MixingHashState MVar4;
  TableEntryPtr *pTVar5;
  uint uVar6;
  NodeBase *pNVar7;
  UntypedMapBase *this_00;
  KeyMapBase<bool> *this_01;
  long lVar8;
  bool bVar9;
  NodeAndBucket NVar10;
  NodeBase aNStack_70 [2];
  UntypedMapBase *pUStack_60;
  
  uVar2 = (this->super_UntypedMapBase).num_buckets_ - 1 & *bucket_index;
  *bucket_index = uVar2;
  if (((ulong)node & 1) != 0) {
    this_00 = (UntypedMapBase *)&stack0xffffffffffffffe0;
    revalidate_if_necessary();
    uVar2 = this_00->num_buckets_;
    if (uVar2 == 1) {
      this_00->index_of_first_non_null_ = 2;
      this_00->num_buckets_ = 2;
      pTVar3 = UntypedMapBase::CreateEmptyTable(this_00,2);
      this_00->table_ = pTVar3;
      aNStack_70[0].next = (NodeBase *)rdtsc();
      pUStack_60 = this_00;
      MVar4 = absl::lts_20240722::hash_internal::
              HashStateBase<absl::lts_20240722::hash_internal::MixingHashState>::
              combine<unsigned_long,google::protobuf::internal::TableEntryPtr*,void_const*>
                        ((MixingHashState)&absl::lts_20240722::hash_internal::MixingHashState::kSeed
                         ,(unsigned_long *)aNStack_70,&this_00->table_,&pUStack_60);
      this_00->seed_ = (map_index_t)MVar4.state_;
      return SUB81(MVar4.state_,0);
    }
    uVar6 = (uint)bucket_index;
    if (uVar6 < 2) {
      pNVar7 = aNStack_70;
      this_01 = (KeyMapBase<bool> *)((ulong)bucket_index & 0xffffffff);
      Resize();
      do {
        pNVar1 = pNVar7->next;
        b = BucketNumber(this_01,(ViewType)(*(byte *)&pNVar7[1].next & 1));
        InsertUnique(this_01,b,(KeyNode *)pNVar7);
        pNVar7 = pNVar1;
      } while (pNVar1 != (NodeBase *)0x0);
      return (bool)extraout_AL_00;
    }
    pTVar3 = this_00->table_;
    this_00->num_buckets_ = uVar6;
    pTVar5 = UntypedMapBase::CreateEmptyTable(this_00,uVar6);
    this_00->table_ = pTVar5;
    uVar6 = this_00->index_of_first_non_null_;
    this_00->index_of_first_non_null_ = this_00->num_buckets_;
    if (uVar6 < uVar2) {
      lVar8 = 0;
      do {
        node_00 = (KeyNode *)pTVar3[(ulong)uVar6 + lVar8];
        if (((ulong)node_00 & 1) == 0 && node_00 != (KeyNode *)0x0) {
          TransferList((KeyMapBase<bool> *)this_00,node_00);
        }
        else if (((ulong)node_00 & 1) != 0) {
          UntypedMapBase::TransferTree
                    (this_00,(Tree *)((long)&node_00[-1].super_NodeBase.next + 7),NodeToVariantKey);
        }
        lVar8 = lVar8 + 1;
      } while (uVar2 - uVar6 != (int)lVar8);
    }
    UntypedMapBase::DeleteTable(this_00,pTVar3,uVar2);
    return (bool)extraout_AL;
  }
  pNVar7 = (NodeBase *)(this->super_UntypedMapBase).table_[uVar2];
  bVar9 = true;
  if (pNVar7 != &node->super_NodeBase) {
    if (((ulong)pNVar7 & 1) == 0 && pNVar7 != (NodeBase *)0x0) {
      do {
        pNVar7 = ((NodeBase *)&pNVar7->next)->next;
        if (pNVar7 == &node->super_NodeBase) break;
      } while (pNVar7 != (NodeBase *)0x0);
      if (pNVar7 != (NodeBase *)0x0) {
        return true;
      }
    }
    NVar10 = FindHelper(this,(ViewType)(*(byte *)&node[1].super_NodeBase.next & 1),it);
    *bucket_index = NVar10.bucket;
    bVar9 = ((this->super_UntypedMapBase).table_[NVar10.bucket] & 1) == 0;
  }
  return bVar9;
}

Assistant:

bool revalidate_if_necessary(map_index_t& bucket_index, KeyNode* node,
                               TreeIterator* it) const {
    // Force bucket_index to be in range.
    bucket_index &= (num_buckets_ - 1);
    // Common case: the bucket we think is relevant points to `node`.
    if (table_[bucket_index] == NodeToTableEntry(node)) return true;
    // Less common: the bucket is a linked list with node_ somewhere in it,
    // but not at the head.
    if (TableEntryIsNonEmptyList(bucket_index)) {
      auto* l = TableEntryToNode(table_[bucket_index]);
      while ((l = l->next) != nullptr) {
        if (l == node) {
          return true;
        }
      }
    }
    // Well, bucket_index_ still might be correct, but probably
    // not.  Revalidate just to be sure.  This case is rare enough that we
    // don't worry about potential optimizations, such as having a custom
    // find-like method that compares Node* instead of the key.
    auto res = FindHelper(node->key(), it);
    bucket_index = res.bucket;
    return TableEntryIsList(bucket_index);
  }